

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O0

void __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLQueryCreateReleaseHelper>::SetName
          (GLObjWrapper<GLObjectWrappers::GLQueryCreateReleaseHelper> *this,GLchar *Name)

{
  Char *Message;
  size_t sVar1;
  char (*in_RCX) [16];
  GLint local_48;
  GLsizei Length;
  undefined1 local_38 [8];
  string msg;
  GLchar *Name_local;
  GLObjWrapper<GLObjectWrappers::GLQueryCreateReleaseHelper> *this_local;
  
  msg.field_2._8_8_ = Name;
  if (Name == (GLchar *)0x0) {
    Diligent::FormatString<char[26],char[16]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x46c89a,
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"SetName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
               ,0x7e);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((__glewObjectLabel != (PFNGLOBJECTLABELPROC)0x0) && (this->m_uiHandle != 0)) {
    if (SetName::MaxLabelLen == 0) {
      glGetIntegerv(0x82e8,&SetName::MaxLabelLen);
      glGetError();
      if (SetName::MaxLabelLen < 1) {
        SetName::MaxLabelLen = 0x100;
      }
      SetName::MaxLabelLen = SetName::MaxLabelLen + -1;
    }
    sVar1 = strlen((char *)msg.field_2._8_8_);
    local_48 = (GLint)sVar1;
    if (SetName::MaxLabelLen < local_48) {
      local_48 = SetName::MaxLabelLen;
    }
    (*__glewObjectLabel)
              (GLQueryCreateReleaseHelper::Type,this->m_uiHandle,local_48,
               (GLchar *)msg.field_2._8_8_);
    glGetError();
  }
  return;
}

Assistant:

void SetName(const GLchar* Name)
    {
#if GL_KHR_debug
        VERIFY_EXPR(Name != nullptr);
        if (glObjectLabel && m_uiHandle)
        {
            static GLint MaxLabelLen = 0;
            if (MaxLabelLen == 0)
            {
                glGetIntegerv(GL_MAX_LABEL_LENGTH, &MaxLabelLen);
#    ifdef DILIGENT_DEVELOPMENT
                glGetError(); // Ignore GL error
#    endif
                if (MaxLabelLen <= 0)
                {
                    // Minimum required value by the spec
                    MaxLabelLen = 256;
                }

                // The spec requires that the number of characters in <label>,
                // excluding the null terminator, is less than the value of MAX_LABEL_LENGTH.
                // In other words, the maximum length of the label is one less than the value of MAX_LABEL_LENGTH.
                --MaxLabelLen;
            }
            GLsizei Length = static_cast<GLsizei>(strlen(Name));
            if (Length > MaxLabelLen)
                Length = MaxLabelLen;

            glObjectLabel(m_CreateReleaseHelper.Type, m_uiHandle, Length, Name);
#    ifdef DILIGENT_DEVELOPMENT
            glGetError(); // Ignore GL error
#    endif
        }
#endif
    }